

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaxi.c
# Opt level: O2

Vec_Int_t * Gia_ManMaxiPerform(Gia_Man_t *p,Vec_Int_t *vInit,int nFrames,int nTimeOut,int fVerbose)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  abctime aVar5;
  Gia_Man_t *p0;
  Gia_Man_t *p1;
  Gia_Man_t *p_00;
  Aig_Man_t *pAig;
  Cnf_Dat_t *p_01;
  sat_solver *s;
  abctime aVar6;
  Vec_Int_t *pVVar7;
  Gia_Obj_t *pGVar8;
  abctime aVar9;
  Vec_Int_t *p_02;
  int *piVar10;
  long lVar11;
  char *pcVar12;
  abctime time;
  abctime time_00;
  abctime time_01;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  size_t __size;
  
  aVar5 = Abc_Clock();
  p0 = Gia_ManMaxiUnfold(p,nFrames,0,vInit);
  p1 = Gia_ManMaxiUnfold(p,nFrames,1,vInit);
  p_00 = Gia_ManMiter(p0,p1,0,0,0,0,0);
  pAig = Gia_ManToAigSimple(p_00);
  pAig->nRegs = 0;
  p_01 = Cnf_Derive(pAig,pAig->nObjs[3]);
  Aig_ManStop(pAig);
  Gia_ManStop(p0);
  Gia_ManStop(p1);
  if (p->nRegs < 1) {
    __assert_fail("Gia_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaxi.c"
                  ,0x98,"Vec_Int_t *Gia_ManMaxiPerform(Gia_Man_t *, Vec_Int_t *, int, int, int)");
  }
  if (fVerbose != 0) {
    pcVar12 = "";
    if (vInit == (Vec_Int_t *)0x0) {
      pcVar12 = "no ";
    }
    printf("Running with %d frames and %sgiven init state.\n",(ulong)(uint)nFrames,pcVar12);
  }
  s = sat_solver_new();
  sat_solver_setnvars(s,p_01->nVars);
  if (nTimeOut == 0) {
    aVar6 = 0;
  }
  else {
    aVar6 = Abc_Clock();
    aVar6 = aVar6 + (long)nTimeOut * 1000000;
  }
  s->nRuntimeLimit = aVar6;
  lVar11 = 0;
  while (lVar11 < p_01->nClauses) {
    iVar1 = sat_solver_addclause(s,p_01->pClauses[lVar11],p_01->pClauses[lVar11 + 1]);
    lVar11 = lVar11 + 1;
    if (iVar1 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaxi.c"
                    ,0xa1,"Vec_Int_t *Gia_ManMaxiPerform(Gia_Man_t *, Vec_Int_t *, int, int, int)");
    }
  }
  pVVar7 = Vec_IntAlloc(p->vCos->nSize);
  iVar1 = 0;
  while ((iVar1 < p_00->vCos->nSize && (pGVar8 = Gia_ManCo(p_00,iVar1), pGVar8 != (Gia_Obj_t *)0x0))
        ) {
    piVar10 = p_01->pVarNums;
    iVar2 = Gia_ObjId(p_00,pGVar8);
    iVar2 = Abc_Var2Lit(piVar10[iVar2],0);
    Vec_IntPush(pVVar7,iVar2);
    iVar1 = iVar1 + 1;
  }
  sat_solver_addclause(s,pVVar7->pArray,pVVar7->pArray + pVVar7->nSize);
  pVVar7->nSize = 0;
  for (iVar1 = 0;
      ((iVar1 < p_00->vCis->nSize - p_00->nRegs &&
       (pGVar8 = Gia_ManCi(p_00,iVar1), pGVar8 != (Gia_Obj_t *)0x0)) && (iVar1 != p->nRegs));
      iVar1 = iVar1 + 1) {
    iVar2 = Vec_IntEntry(vInit,iVar1);
    if ((iVar2 == 0) || (iVar2 = Vec_IntEntry(vInit,iVar1), iVar2 == 1)) {
      piVar10 = p_01->pVarNums;
      iVar2 = Gia_ObjId(p_00,pGVar8);
      iVar2 = Abc_Var2Lit(piVar10[iVar2],1);
      Vec_IntPush(pVVar7,iVar2);
    }
  }
  if (fVerbose != 0) {
    printf("Iter%6d : ",0);
    uVar3 = sat_solver_nvars(s);
    printf("Var =%10d  ",(ulong)uVar3);
    uVar3 = sat_solver_nclauses(s);
    printf("Clause =%10d  ",(ulong)uVar3);
    uVar3 = sat_solver_nconflicts(s);
    printf("Conflict =%10d  ",(ulong)uVar3);
    printf("Subset =%6d  ");
    Abc_PrintTime(0x816bba,(char *)0x0,time);
  }
  pcVar12 = (char *)0x0;
  uVar13 = 0;
  while (iVar1 = (int)uVar13, iVar1 != 1000000) {
    aVar6 = Abc_Clock();
    uVar3 = pVVar7->nSize;
    iVar2 = sat_solver_solve(s,pVVar7->pArray,pVVar7->pArray + (int)uVar3,0,0,0,0);
    aVar9 = Abc_Clock();
    if (iVar2 != -1) {
      if (iVar2 == 1) {
        printf("The problem is SAT after %d iterations.  ",uVar13);
      }
      else {
        if (iVar2 != 0) {
          __assert_fail("status == l_False",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaxi.c"
                        ,0xce,
                        "Vec_Int_t *Gia_ManMaxiPerform(Gia_Man_t *, Vec_Int_t *, int, int, int)");
        }
        pcVar12 = "Timeout reached after %d seconds and %d iterations.  ";
        uVar14 = (ulong)(uint)nTimeOut;
LAB_004aaa7f:
        printf(pcVar12,uVar14,uVar13);
      }
      goto LAB_004aaa8b;
    }
    pcVar12 = pcVar12 + (aVar9 - aVar6);
    piVar10 = (s->conf_final).ptr;
    uVar15 = (s->conf_final).size;
    if (fVerbose != 0) {
      printf("Iter%6d : ",(ulong)(iVar1 + 1));
      uVar4 = sat_solver_nvars(s);
      printf("Var =%10d  ",(ulong)uVar4);
      uVar4 = sat_solver_nclauses(s);
      printf("Clause =%10d  ",(ulong)uVar4);
      uVar4 = sat_solver_nconflicts(s);
      printf("Conflict =%10d  ",(ulong)uVar4);
      printf("Subset =%6d  ",(ulong)uVar15);
      Abc_PrintTime(0x816bba,pcVar12,time_00);
    }
    if (uVar3 == uVar15) {
      uVar13 = (ulong)(iVar1 + 1);
      pcVar12 = "Reached fixed point with %d entries after %d iterations.  ";
      uVar14 = (ulong)uVar3;
      goto LAB_004aaa7f;
    }
    pVVar7->nSize = 0;
    if ((int)uVar15 < 1) {
      uVar15 = 0;
    }
    for (uVar13 = 0; uVar15 != uVar13; uVar13 = uVar13 + 1) {
      iVar2 = Abc_LitNot(piVar10[uVar13]);
      Vec_IntPush(pVVar7,iVar2);
    }
    uVar13 = (ulong)(iVar1 + 1);
  }
  uVar3 = pVVar7->nSize;
LAB_004aaa8b:
  p_02 = Vec_IntStart(p_01->nVars);
  uVar15 = 0;
  if ((int)uVar3 < 1) {
    uVar3 = 0;
  }
  for (; uVar3 != uVar15; uVar15 = uVar15 + 1) {
    iVar1 = Vec_IntEntry(pVVar7,uVar15);
    iVar1 = Abc_Lit2Var(iVar1);
    Vec_IntWriteEntry(p_02,iVar1,1);
  }
  Vec_IntFree(pVVar7);
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  iVar1 = vInit->nSize;
  iVar2 = 0;
  pVVar7->nSize = iVar1;
  pVVar7->nCap = iVar1;
  if ((long)iVar1 == 0) {
    __size = 0;
    piVar10 = (int *)0x0;
  }
  else {
    __size = (long)iVar1 << 2;
    piVar10 = (int *)malloc(__size);
  }
  pVVar7->pArray = piVar10;
  memcpy(piVar10,vInit->pArray,__size);
  do {
    if (((p_00->vCis->nSize - p_00->nRegs <= iVar2) ||
        (pGVar8 = Gia_ManCi(p_00,iVar2), pGVar8 == (Gia_Obj_t *)0x0)) || (iVar2 == p->nRegs)) {
      Vec_IntFree(p_02);
      sat_solver_delete(s);
      Cnf_DataFree(p_01);
      Gia_ManStop(p_00);
      aVar6 = Abc_Clock();
      Abc_PrintTime(0x79ba37,(char *)(aVar6 - aVar5),time_01);
      return pVVar7;
    }
    iVar1 = Vec_IntEntry(pVVar7,iVar2);
    if ((iVar1 == 4) || (iVar1 = Vec_IntEntry(pVVar7,iVar2), iVar1 == 5)) {
      uVar3 = Vec_IntEntry(pVVar7,iVar2);
LAB_004aab8a:
      Vec_IntWriteEntry(pVVar7,iVar2,uVar3);
    }
    else {
      iVar1 = Vec_IntEntry(pVVar7,iVar2);
      if ((iVar1 == 0) || (iVar1 = Vec_IntEntry(pVVar7,iVar2), iVar1 == 1)) {
        piVar10 = p_01->pVarNums;
        iVar1 = Gia_ObjId(p_00,pGVar8);
        iVar1 = Vec_IntEntry(p_02,piVar10[iVar1]);
        if (iVar1 == 0) {
          uVar3 = Vec_IntEntry(pVVar7,iVar2);
          uVar3 = uVar3 | 2;
          goto LAB_004aab8a;
        }
      }
    }
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Gia_ManMaxiPerform( Gia_Man_t * p, Vec_Int_t * vInit, int nFrames, int nTimeOut, int fVerbose )
{
    int nIterMax = 1000000;
    int i, iLit, Iter, status;
    int nLits, * pLits;
    abctime clkTotal = Abc_Clock();
    abctime clkSat = 0;
    Vec_Int_t * vLits, * vMap;
    sat_solver * pSat;
    Gia_Obj_t * pObj;
    Gia_Man_t * p0 = Gia_ManMaxiUnfold( p, nFrames, 0, vInit );
    Gia_Man_t * p1 = Gia_ManMaxiUnfold( p, nFrames, 1, vInit );
    Gia_Man_t * pM = Gia_ManMiter( p0, p1, 0, 0, 0, 0, 0 );
    Cnf_Dat_t * pCnf = Cnf_DeriveGiaRemapped( pM );
    Gia_ManStop( p0 );
    Gia_ManStop( p1 );
    assert( Gia_ManRegNum(p) > 0 );
    if ( fVerbose )
        printf( "Running with %d frames and %sgiven init state.\n", nFrames, vInit ? "":"no " );

    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, pCnf->nVars );
    sat_solver_set_runtime_limit( pSat, nTimeOut ? nTimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0 );
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
            assert( 0 );

    // add one large OR clause
    vLits = Vec_IntAlloc( Gia_ManCoNum(p) );
    Gia_ManForEachCo( pM, pObj, i )
        Vec_IntPush( vLits, Abc_Var2Lit(pCnf->pVarNums[Gia_ObjId(pM, pObj)], 0) );
    sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits) );

    // create assumptions
    Vec_IntClear( vLits );
    Gia_ManForEachPi( pM, pObj, i )
        if ( i == Gia_ManRegNum(p) )
            break;
        else if ( Vec_IntEntry(vInit, i) == 0 || Vec_IntEntry(vInit, i) == 1 )
            Vec_IntPush( vLits, Abc_Var2Lit(pCnf->pVarNums[Gia_ObjId(pM, pObj)], 1) );

    if ( fVerbose )
    {
        printf( "Iter%6d : ",       0 );
        printf( "Var =%10d  ",      sat_solver_nvars(pSat) );
        printf( "Clause =%10d  ",   sat_solver_nclauses(pSat) );
        printf( "Conflict =%10d  ", sat_solver_nconflicts(pSat) );
        printf( "Subset =%6d  ",    Vec_IntSize(vLits) );
        Abc_PrintTime( 1, "Time", clkSat );
//      ABC_PRTr( "Solver time", clkSat );
    }
    for ( Iter = 0; Iter < nIterMax; Iter++ )
    {
        abctime clk = Abc_Clock();
        status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        clkSat += Abc_Clock() - clk;
        if ( status == l_Undef )
        {
//            if ( fVerbose )
//                printf( "\n" );
            printf( "Timeout reached after %d seconds and %d iterations.  ", nTimeOut, Iter );
            break;
        }
        if ( status == l_True )
        {
//            if ( fVerbose )
//                printf( "\n" );
            printf( "The problem is SAT after %d iterations.  ", Iter );
            break;
        }
        assert( status == l_False );
        nLits = sat_solver_final( pSat, &pLits );
        if ( fVerbose )
        {
            printf( "Iter%6d : ",       Iter+1 );
            printf( "Var =%10d  ",      sat_solver_nvars(pSat) );
            printf( "Clause =%10d  ",   sat_solver_nclauses(pSat) );
            printf( "Conflict =%10d  ", sat_solver_nconflicts(pSat) );
            printf( "Subset =%6d  ",    nLits );
            Abc_PrintTime( 1, "Time", clkSat );
//            ABC_PRTr( "Solver time", clkSat );
        }
        if ( Vec_IntSize(vLits) == nLits )
        {
//            if ( fVerbose )
//                printf( "\n" );
            printf( "Reached fixed point with %d entries after %d iterations.  ", Vec_IntSize(vLits), Iter+1 );
            break;
        }
        // collect used literals
        Vec_IntClear( vLits );
        for ( i = 0; i < nLits; i++ )
            Vec_IntPush( vLits, Abc_LitNot(pLits[i]) );
    }
    // create map
    vMap = Vec_IntStart( pCnf->nVars );
    Vec_IntForEachEntry( vLits, iLit, i )
        Vec_IntWriteEntry( vMap, Abc_Lit2Var(iLit), 1 );

    // create output
    Vec_IntFree( vLits );
    vLits = Vec_IntDup(vInit);
    Gia_ManForEachPi( pM, pObj, i )
        if ( i == Gia_ManRegNum(p) )
            break;
        else if ( Vec_IntEntry(vLits, i) == 4 || Vec_IntEntry(vLits, i) == 5 )
            Vec_IntWriteEntry( vLits, i, Vec_IntEntry(vLits, i) );
        else if ( (Vec_IntEntry(vLits, i) == 0 || Vec_IntEntry(vLits, i) == 1) && !Vec_IntEntry(vMap, pCnf->pVarNums[Gia_ObjId(pM, pObj)]) )
            Vec_IntWriteEntry( vLits, i, Vec_IntEntry(vLits, i) | 2 );
    Vec_IntFree( vMap );

    // cleanup
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );
    Gia_ManStop( pM );
    Abc_PrintTime( 1, "Total runtime", Abc_Clock() - clkTotal );
    return vLits;
}